

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O3

Result<wasm::HeapType> *
wasm::WATParser::anon_unknown_11::
typeidx<wasm::WATParser::(anonymous_namespace)::ParseImplicitTypeDefsCtx>
          (Result<wasm::HeapType> *__return_storage_ptr__,ParseImplicitTypeDefsCtx *ctx)

{
  ParseInput *this;
  char *pcVar1;
  undefined8 *puVar2;
  undefined1 *puVar3;
  string *reason;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  pointer pHVar4;
  undefined8 uVar5;
  optional<unsigned_int> oVar6;
  __node_base_ptr p_Var7;
  Result<wasm::HeapType> *extraout_RAX;
  Result<wasm::HeapType> *extraout_RAX_00;
  Result<wasm::HeapType> *pRVar8;
  key_type local_118;
  size_type local_108;
  size_type __dnew;
  optional<wasm::Name> id;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Storage<unsigned_int,_true> local_c8;
  undefined4 uStack_c4;
  MaybeResult<unsigned_int> idx;
  size_type __dnew_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined1 local_80 [8];
  Result<unsigned_int> _val;
  Result<unsigned_int> idx_1;
  
  this = &ctx->in;
  oVar6 = ParseInput::takeU32(this);
  if (((ulong)oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
    ParseInput::takeID((optional<wasm::Name> *)&__dnew,this);
    if (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\x01') {
      local_118.super_IString.str._M_len = __dnew;
      local_118.super_IString.str._M_str =
           (char *)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                   _M_len;
      this_00 = &((ctx->
                  super_TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseImplicitTypeDefsCtx>
                  ).typeIndices)->_M_h;
      p_Var7 = std::
               _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_before_node
                         (this_00,id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                                  super__Optional_payload_base<wasm::Name>._M_payload._M_value.
                                  super_IString.str._M_len % this_00->_M_bucket_count,&local_118,
                          id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                          super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString
                          .str._M_len);
      if ((p_Var7 == (__node_base_ptr)0x0) || (p_Var7->_M_nxt == (_Hash_node_base *)0x0)) {
        idx.val.super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        _32_8_ = &local_90;
        local_108 = 0x17;
        reason = (string *)
                 ((long)&idx.val.
                         super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x20);
        idx.val.super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        _32_8_ = std::__cxx11::string::_M_create((ulong *)reason,(ulong)&local_108);
        local_90._M_allocated_capacity = local_108;
        builtin_strncpy((char *)idx.val.
                                super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                ._32_8_,"unknown type identifier",0x17);
        __dnew_1 = local_108;
        *(char *)(idx.val.
                  super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                  .
                  super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                  .super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                  .super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                  .
                  super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                  ._32_8_ + local_108) = '\0';
        ParseInput::err((Err *)local_80,this,reason);
        _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._32_8_ =
             (long)&idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                    super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                    super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                    super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                    super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 8;
        pcVar1 = (char *)((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                                 super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                 super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                 super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                                 super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 8);
        if (local_80 == (undefined1  [8])pcVar1) {
          idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._16_8_ =
               _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._16_8_;
        }
        else {
          _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._32_8_ = local_80;
        }
        idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._8_8_ =
             _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._8_8_;
        idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._0_8_ =
             _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._0_8_;
        _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._0_8_ = 0;
        _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._8_8_ =
             _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._8_8_ &
             0xffffffffffffff00;
        idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._24_1_ = 1;
        local_80 = (undefined1  [8])pcVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)idx.val.
               super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
               ._32_8_ != &local_90) {
          operator_delete((void *)idx.val.
                                  super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  ._32_8_,local_90._M_allocated_capacity + 1);
        }
      }
      else {
        _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._32_4_ =
             *(undefined4 *)&p_Var7->_M_nxt[3]._M_nxt;
        idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._24_1_ = 0;
      }
      std::__detail::__variant::_Copy_ctor_base<false,_unsigned_int,_wasm::WATParser::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_unsigned_int,_wasm::WATParser::Err> *)local_80,
                      (_Copy_ctor_base<false,_unsigned_int,_wasm::WATParser::Err> *)
                      ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                              super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                              super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                              super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                              super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 0x20));
      if (_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._24_1_ == '\x01') {
        idx.val.super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        _32_8_ = &local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&idx.val.
                           super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 0x20),local_80,
                   (char *)(_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                            super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                            super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                            super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                            super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                            super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u.
                            _0_8_ + (long)local_80));
        _local_c8 = (long)&idx.val.
                           super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                    + 8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)idx.val.
               super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
               ._32_8_ == &local_90) {
          idx.val.super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
          _M_u._16_8_ = local_90._8_8_;
        }
        else {
          _local_c8 = idx.val.
                      super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                      ._32_8_;
        }
        idx.val.super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>._M_u
        ._8_8_ = local_90._M_allocated_capacity;
        idx.val.super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>._M_u
        ._0_8_ = __dnew_1;
        idx.val.super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>._M_u
        ._24_1_ = 2;
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::WATParser::Err> *)local_80);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::WATParser::Err> *)local_80);
        uVar5 = _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._32_8_;
        local_c8._M_value._0_1_ =
             _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_index;
        local_c8._M_value._1_3_ =
             _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._33_3_;
        idx.val.super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>._M_u
        ._24_1_ = 0;
        _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._32_8_ = uVar5;
      }
      std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::WATParser::Err> *)
                        ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                                super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                                super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 0x20));
      if (idx.val.super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
          _M_u._24_1_ != '\x01') goto LAB_00a14060;
    }
    else {
      idx.val.super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>._M_u.
      _24_1_ = 1;
    }
    std::__detail::__variant::
    _Variant_storage<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)&local_c8);
    id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Name>._16_8_ = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged,
               "expected type index or identifier","");
    ParseInput::err((Err *)((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 0x20
                           ),this,
                    (string *)
                    &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._M_engaged);
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> = puVar2;
    pRVar8 = (Result<wasm::HeapType> *)
             ((long)&idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 8);
    if ((Result<wasm::HeapType> *)
        _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._32_8_ == pRVar8) {
      *puVar2 = idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._8_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x18) =
           idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
           super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
           super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
           super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
           super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> =
           _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
           super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
           super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
           super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
           super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._32_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x10) =
           idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
           super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
           super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
           super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
           super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._8_8_;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>
             .super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 8) =
         idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
         super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
         super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
         super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
         super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
         super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._0_8_;
    idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
    super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
    super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
    super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
    super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._0_8_ = 0;
    idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
    super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
    super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
    super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
    super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._8_8_ =
         idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
         super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
         super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
         super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
         super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
         super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._8_8_ &
         0xffffffffffffff00;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>
             .super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20) = '\x01';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Name>._16_8_ != &local_d8) {
      _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._32_8_ = pRVar8;
      operator_delete((void *)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                              super__Optional_payload_base<wasm::Name>._16_8_,
                      local_d8._M_allocated_capacity + 1);
      pRVar8 = extraout_RAX_00;
    }
  }
  else {
    local_c8._M_value =
         oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_payload;
    idx.val.super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>._M_u.
    _24_1_ = 0;
LAB_00a14060:
    std::__detail::__variant::
    _Copy_ctor_base<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                     *)((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                               super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                               super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                               super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                               super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 0x20),
                    (_Copy_ctor_base<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                     *)&local_c8);
    if (idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._24_1_ == '\x02') {
      pcVar1 = (char *)((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                               super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                               super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                               super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                               super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 8);
      local_80 = (undefined1  [8])pcVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,
                 _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                 super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._32_8_,
                 idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                 super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._0_8_ +
                 _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                 super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._32_8_);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> = puVar2;
      if (local_80 == (undefined1  [8])pcVar1) {
        *puVar2 = _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                  super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                  super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                  super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                  super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                  super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._8_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x18) =
             _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> = local_80;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x10) =
             _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._8_8_;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 8) =
           _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
           super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
           super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
           super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
           super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._0_8_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20) = '\x01';
      std::__detail::__variant::
      _Variant_storage<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 0x20
                           ));
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 0x20
                           ));
      pHVar4 = (ctx->types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((_local_c8 & 0xffffffff) <
          (ulong)((long)(ctx->types->
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl
                        .super__Vector_impl_data._M_finish - (long)pHVar4 >> 3)) {
        *(uintptr_t *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> =
             pHVar4[_local_c8 & 0xffffffff].id;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20) = '\0';
      }
      else {
        pcVar1 = (char *)((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                                 super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                 super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                 super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                                 super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 8);
        idx.val.super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        _M_index = '\x18';
        idx.val.super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        _33_7_ = 0;
        local_80 = (undefined1  [8])pcVar1;
        local_80 = (undefined1  [8])
                   std::__cxx11::string::_M_create
                             ((ulong *)local_80,
                              (ulong)((long)&idx.val.
                                             super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                             .
                                             super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                             .
                                             super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                             .
                                             super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                             .
                                             super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     + 0x20));
        _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._8_8_ =
             idx.val.super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
             ._32_8_;
        builtin_strncpy((char *)local_80,"type index out of bounds",0x18);
        _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._0_8_ =
             idx.val.super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
             ._32_8_;
        *(char *)((long)local_80 +
                 idx.val.
                 super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
                 super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                 ._32_8_) = '\0';
        ParseInput::err((Err *)((long)&_val.val.
                                       super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                                       super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                       super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                       super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                                       super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> +
                               0x20),this,(string *)local_80);
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> = puVar2;
        puVar3 = (undefined1 *)
                 ((long)&idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 8);
        if ((undefined1 *)
            _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
            super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
            super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
            super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
            super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
            super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._32_8_ == puVar3) {
          *puVar2 = idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                    super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                    super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                    super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                    super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                    super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._8_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x18) =
               idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._16_8_;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
            super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
            super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
            super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
            super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> =
               _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._32_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x10) =
               idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._8_8_;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 8) =
             idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._0_8_;
        idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._0_8_ = 0;
        idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._8_8_ =
             idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._8_8_ &
             0xffffffffffffff00;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20) = '\x01'
        ;
        _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._32_8_ = puVar3;
        if (local_80 != (undefined1  [8])pcVar1) {
          operator_delete((void *)local_80,
                          _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                          super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                          super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                          super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                          super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                          super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u.
                          _8_8_ + 1);
        }
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)&local_c8);
    pRVar8 = extraout_RAX;
  }
  return pRVar8;
}

Assistant:

Result<typename Ctx::HeapTypeT> typeidx(Ctx& ctx) {
  if (auto idx = maybeTypeidx(ctx)) {
    CHECK_ERR(idx);
    return ctx.getHeapTypeFromIdx(*idx);
  }
  return ctx.in.err("expected type index or identifier");
}